

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_test.cc
# Opt level: O2

void __thiscall PKCS7Test_CertReparseNSS_Test::TestBody(PKCS7Test_CertReparseNSS_Test *this)

{
  string local_28;
  
  GetTestData_abi_cxx11_(&local_28,"crypto/pkcs7/test/nss.p7c");
  TestCertReparse((Span<const_unsigned_char>)local_28._0_16_);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(PKCS7Test, CertReparseNSS) {
  // nss.p7c contains the certificate chain of mail.google.com, as saved by NSS
  // using the Chrome UI.
  TestCertReparse(
      bssl::StringAsBytes(GetTestData("crypto/pkcs7/test/nss.p7c")));
}